

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O2

qint64 __thiscall QFileInfo::size(QFileInfo *this)

{
  uint uVar1;
  QFileInfoPrivate *pQVar2;
  _Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_> _Var3;
  qint64 qVar4;
  
  pQVar2 = (this->d_ptr).d.ptr;
  uVar1 = *(uint *)&pQVar2->field_0x1d8;
  if ((uVar1 >> 0x1e & 1) == 0) {
    _Var3.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl =
         (pQVar2->fileEngine)._M_t.
         super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>._M_t.
         super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
         super__Head_base<0UL,_QAbstractFileEngine_*,_false>;
    if (_Var3.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl ==
        (QAbstractFileEngine *)0x0) {
      if ((-1 < (int)uVar1) ||
         ((*(byte *)((long)&(pQVar2->metaData).knownFlagsMask.
                            super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                            super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i + 2) & 0x20) ==
          0)) {
        QFileSystemEngine::fillMetaData
                  (&pQVar2->fileEntry,&pQVar2->metaData,(MetaDataFlags)0x200000);
      }
      qVar4 = (pQVar2->metaData).size_;
    }
    else if ((~uVar1 & 0x80000008) == 0) {
      qVar4 = pQVar2->fileSize;
    }
    else {
      if ((int)uVar1 < 0) {
        *(uint *)&pQVar2->field_0x1d8 = uVar1 | 8;
      }
      qVar4 = (**(code **)(*(long *)_Var3.super__Head_base<0UL,_QAbstractFileEngine_*,_false>.
                                    _M_head_impl + 0x30))();
      pQVar2->fileSize = qVar4;
    }
  }
  else {
    qVar4 = 0;
  }
  return qVar4;
}

Assistant:

constexpr P get() const noexcept { return ptr; }